

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcValveType::IfcValveType(IfcValveType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcValveType";
  Schema_2x3::IfcFlowControllerType::IfcFlowControllerType
            (&this->super_IfcFlowControllerType,&PTR_construction_vtable_24__008458b0);
  *(undefined8 *)&(this->super_IfcFlowControllerType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x845730;
  *(undefined8 *)&this->field_0x1e0 = 0x845898;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x845758;
  (this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x845780;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x8457a8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8457d0;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x8457f8;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x845820;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x845848;
  *(undefined8 *)
   &(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.field_0x1b0 = 0x845870;
  *(undefined1 **)&(this->super_IfcFlowControllerType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcValveType() : Object("IfcValveType") {}